

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

Type __thiscall capnp::ConstSchema::getType(ConstSchema *this)

{
  Reader proto;
  Type TVar1;
  StructReader local_98;
  PointerReader local_68;
  StructReader local_48;
  
  local_68.pointer = (WirePointer *)((this->super_Schema).raw)->generic->encodedNode;
  local_68.segment = (SegmentReader *)0x0;
  local_68.capTable = (CapTableReader *)0x0;
  local_68.nestingLimit = 0x7fffffff;
  capnp::_::PointerReader::getStruct(&local_98,&local_68,(word *)0x0);
  local_68.pointer = (WirePointer *)0x0;
  local_68.segment = (SegmentReader *)0x0;
  local_68.capTable = (CapTableReader *)0x0;
  local_68.nestingLimit = 0x7fffffff;
  if (3 < local_98.pointerCount) {
    local_68.pointer = local_98.pointers + 3;
    local_68.segment = local_98.segment;
    local_68.capTable = local_98.capTable;
    local_68.nestingLimit = local_98.nestingLimit;
  }
  capnp::_::PointerReader::getStruct(&local_48,&local_68,(word *)0x0);
  proto._reader.capTable = local_48.capTable;
  proto._reader.segment = local_48.segment;
  proto._reader.data = local_48.data;
  proto._reader.pointers = local_48.pointers;
  proto._reader.dataSize = local_48.dataSize;
  proto._reader.pointerCount = local_48.pointerCount;
  proto._reader._38_2_ = local_48._38_2_;
  proto._reader.nestingLimit = local_48.nestingLimit;
  proto._reader._44_4_ = local_48._44_4_;
  TVar1 = Schema::interpretType(&this->super_Schema,proto,0x5000000);
  return TVar1;
}

Assistant:

Type ConstSchema::getType() const {
  return interpretType(getProto().getConst().getType(),
      _::RawBrandedSchema::makeDepLocation(_::RawBrandedSchema::DepKind::CONST_TYPE, 0));
}